

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::write_int_data<char>::write_int_data
          (write_int_data<char> *this,int num_digits,string_view prefix,
          basic_format_specs<char> *specs)

{
  type tVar1;
  size_t sVar2;
  type width;
  basic_format_specs<char> *specs_local;
  int num_digits_local;
  write_int_data<char> *this_local;
  string_view prefix_local;
  
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (write_int_data<char> *)prefix.data_;
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  tVar1 = to_unsigned<int>(num_digits);
  this->size = sVar2 + tVar1;
  this->padding = 0;
  if ((specs->field_0x9 & 0xf) == 4) {
    tVar1 = to_unsigned<int>(specs->width);
    if (this->size < (ulong)tVar1) {
      this->padding = (ulong)tVar1 - this->size;
      this->size = (ulong)tVar1;
    }
  }
  else if (num_digits < specs->precision) {
    sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
    tVar1 = to_unsigned<int>(specs->precision);
    this->size = sVar2 + tVar1;
    tVar1 = to_unsigned<int>(specs->precision - num_digits);
    this->padding = (ulong)tVar1;
  }
  return;
}

Assistant:

write_int_data(int num_digits, string_view prefix,
                 const basic_format_specs<Char>& specs)
      : size(prefix.size() + to_unsigned(num_digits)), padding(0) {
    if (specs.align == align::numeric) {
      auto width = to_unsigned(specs.width);
      if (width > size) {
        padding = width - size;
        size = width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
    }
  }